

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_event_thread.c
# Opt level: O2

void notifywrite_cb(void *data)

{
  ares_thread_mutex_lock(*(ares_thread_mutex_t **)((long)data + 0x10));
  *(undefined4 *)((long)data + 0x20) = 1;
  ares_thread_mutex_unlock(*(ares_thread_mutex_t **)((long)data + 0x10));
  ares_event_thread_wake((ares_event_thread_t *)data);
  return;
}

Assistant:

static void notifywrite_cb(void *data)
{
  ares_event_thread_t *e = data;

  ares_thread_mutex_lock(e->mutex);
  e->process_pending_write = ARES_TRUE;
  ares_thread_mutex_unlock(e->mutex);

  ares_event_thread_wake(e);
}